

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

int __thiscall
deqp::gls::LongStressCaseInternal::Texture::getApproxMemUsageDiff
          (Texture *this,int width,int height,deUint32 internalFormat,bool useMipmap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_38;
  int local_34;
  int level;
  int memUsageApproxAfter;
  int local_28;
  int local_24;
  int pixelSize;
  int numLevels;
  int iStack_18;
  bool useMipmap_local;
  deUint32 internalFormat_local;
  int height_local;
  int width_local;
  Texture *this_local;
  
  pixelSize._3_1_ = useMipmap;
  numLevels = internalFormat;
  iStack_18 = height;
  internalFormat_local = width;
  _height_local = this;
  if (useMipmap) {
    iVar1 = de::max<int>(width,height);
    local_44 = ::deLog2Floor32(iVar1);
    local_44 = local_44 + 1;
  }
  else {
    local_44 = 1;
  }
  local_24 = local_44;
  if (numLevels == 0x1908) {
    local_48 = 4;
  }
  else {
    if (numLevels == 0x1907) {
      local_4c = 3;
    }
    else {
      if (numLevels == 0x1906) {
        local_50 = 1;
      }
      else {
        _level = glu::mapGLInternalFormat(numLevels);
        local_50 = tcu::TextureFormat::getPixelSize((TextureFormat *)&level);
      }
      local_4c = local_50;
    }
    local_48 = local_4c;
  }
  local_28 = local_48;
  local_34 = 0;
  for (local_38 = 0; local_38 < local_24; local_38 = local_38 + 1) {
    iVar1 = de::max<int>(1,(int)internalFormat_local >> ((byte)local_38 & 0x1f));
    iVar2 = de::max<int>(1,iStack_18 >> ((byte)local_38 & 0x1f));
    iVar3 = 1;
    if (this->m_type == TEXTURETYPE_CUBE) {
      iVar3 = 6;
    }
    local_34 = iVar1 * iVar2 * local_28 * iVar3 + local_34;
  }
  iVar1 = getApproxMemUsage(this);
  return local_34 - iVar1;
}

Assistant:

int Texture::getApproxMemUsageDiff (const int width, const int height, const deUint32 internalFormat, const bool useMipmap) const
{
	const int	numLevels				= useMipmap ? deLog2Floor32(de::max(width, height))+1 : 1;
	const int	pixelSize				= internalFormat == GL_RGBA		? 4
										: internalFormat == GL_RGB		? 3
										: internalFormat == GL_ALPHA	? 1
										: glu::mapGLInternalFormat(internalFormat).getPixelSize();
	int			memUsageApproxAfter		= 0;

	for (int level = 0; level < numLevels; level++)
		memUsageApproxAfter += de::max(1, width>>level) * de::max(1, height>>level) * pixelSize * (m_type == TEXTURETYPE_CUBE ? 6 : 1);

	return memUsageApproxAfter - getApproxMemUsage();
}